

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_hexdump_connection(mg_connection *nc,char *path,void *buf,int num_bytes,int ev)

{
  int dst_len;
  int iVar1;
  time_t tVar2;
  char *dst_00;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char local_b8 [4];
  int buf_size;
  char dst [60];
  char src [60];
  char *hexbuf;
  FILE *fp;
  int ev_local;
  int num_bytes_local;
  void *buf_local;
  char *path_local;
  mg_connection *nc_local;
  
  dst_len = num_bytes * 5 + 100;
  iVar1 = strcmp(path,"-");
  if (iVar1 == 0) {
    hexbuf = _stdout;
  }
  else {
    iVar1 = strcmp(path,"--");
    if (iVar1 == 0) {
      hexbuf = _stderr;
    }
    else {
      hexbuf = (char *)fopen64(path,"a");
    }
  }
  if (hexbuf != (char *)0x0) {
    mg_conn_addr_to_str(nc,dst + 0x38,0x3c,3);
    mg_conn_addr_to_str(nc,local_b8,0x3c,7);
    tVar2 = time((time_t *)0x0);
    if (ev == 3) {
      local_e8 = "<-";
    }
    else {
      if (ev == 4) {
        local_f0 = "->";
      }
      else {
        if (ev == 1) {
          local_f8 = "<A";
        }
        else {
          local_f8 = "XX";
          if (ev == 2) {
            local_f8 = "C>";
          }
        }
        local_f0 = local_f8;
      }
      local_e8 = local_f0;
    }
    fprintf((FILE *)hexbuf,"%lu %p %s %s %s %d\n",tVar2,nc,dst + 0x38,local_e8,local_b8,num_bytes);
    if ((0 < num_bytes) && (dst_00 = (char *)malloc((long)dst_len), dst_00 != (char *)0x0)) {
      mg_hexdump(buf,num_bytes,dst_00,dst_len);
      fprintf((FILE *)hexbuf,"%s",dst_00);
      free(dst_00);
    }
    if ((hexbuf != _stdin) && (hexbuf != _stdout)) {
      fclose((FILE *)hexbuf);
    }
  }
  return;
}

Assistant:

void mg_hexdump_connection(struct mg_connection *nc, const char *path,
                           const void *buf, int num_bytes, int ev) {
    FILE *fp = NULL;
    char *hexbuf, src[60], dst[60];
    int buf_size = num_bytes * 5 + 100;

    if (strcmp(path, "-") == 0) {
        fp = stdout;
    } else if (strcmp(path, "--") == 0) {
        fp = stderr;
#ifndef MG_DISABLE_FILESYSTEM
    } else {
        fp = fopen(path, "a");
#endif
    }
    if (fp == NULL) return;

    mg_conn_addr_to_str(nc, src, sizeof(src),
                        MG_SOCK_STRINGIFY_IP | MG_SOCK_STRINGIFY_PORT);
    mg_conn_addr_to_str(nc, dst, sizeof(dst), MG_SOCK_STRINGIFY_IP |
                                              MG_SOCK_STRINGIFY_PORT |
                                              MG_SOCK_STRINGIFY_REMOTE);
    fprintf(
            fp, "%lu %p %s %s %s %d\n", (unsigned long) time(NULL), nc, src,
            ev == MG_EV_RECV ? "<-" : ev == MG_EV_SEND
                                      ? "->"
                                      : ev == MG_EV_ACCEPT
                                        ? "<A"
                                        : ev == MG_EV_CONNECT ? "C>" : "XX",
            dst, num_bytes);
    if (num_bytes > 0 && (hexbuf = (char *) MG_MALLOC(buf_size)) != NULL) {
        mg_hexdump(buf, num_bytes, hexbuf, buf_size);
        fprintf(fp, "%s", hexbuf);
        MG_FREE(hexbuf);
    }
    if (fp != stdin && fp != stdout) fclose(fp);
}